

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

EVclient_sources INT_EVclient_register_source(char *name,EVsource src)

{
  int iVar1;
  _event_path_data *p_Var2;
  EVclient_sources p_Var3;
  char *pcVar4;
  
  p_Var2 = src->cm->evp;
  if ((long)p_Var2->source_count == 0) {
    p_Var3 = (EVclient_sources)INT_CMmalloc(0x10);
  }
  else {
    p_Var3 = (EVclient_sources)
             INT_CMrealloc(p_Var2->sources,(long)p_Var2->source_count * 0x10 + 0x10);
  }
  p_Var2->sources = p_Var3;
  pcVar4 = strdup(name);
  iVar1 = p_Var2->source_count;
  p_Var3[iVar1].name = pcVar4;
  p_Var3[iVar1].src = src;
  p_Var2->source_count = iVar1 + 1;
  return p_Var3;
}

Assistant:

extern EVclient_sources
INT_EVclient_register_source(char *name, EVsource src)
{
    CManager cm = src->cm;
    event_path_data evp = cm->evp;
    if (evp->source_count == 0) {
	evp->sources = malloc(sizeof(evp->sources[0]));
    } else {
	evp->sources = realloc(evp->sources,
			       sizeof(evp->sources[0]) * (evp->source_count + 1));
    }
    evp->sources[evp->source_count].name = strdup(name);
    evp->sources[evp->source_count].src = src;
    evp->source_count++;
    return evp->sources;
}